

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O2

void mainverttest(void)

{
  uint uVar1;
  double dStack_68;
  double ma [3];
  double dStack_48;
  double ar [3];
  
  dStack_68 = 1.0;
  ma[0] = -0.06331;
  ma[1] = 0.199;
  dStack_48 = -1.23;
  ar[0] = 0.4;
  ar[1] = 0.0;
  mdisplay(&dStack_68,1,3);
  invertroot(3,&dStack_68);
  mdisplay(&dStack_68,1,3);
  uVar1 = archeck(2,&dStack_48);
  printf("ARCHECK %d \n",(ulong)uVar1);
  return;
}

Assistant:

void mainverttest() {
	int ret;
	double ma[3] = {1.0, -0.06331,0.1990};
	double ar[3] = {-1.23,0.4};

	mdisplay(ma,1,3);

	invertroot(3,ma);

	mdisplay(ma,1,3);

	ret = archeck(2,ar);
	printf("ARCHECK %d \n",ret);
}